

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

int32 mkvmuxer::SerializeInt(IMkvWriter *writer,int64 value,int32 size)

{
  int iVar1;
  int32 iVar2;
  ulong uVar3;
  int32 bit_count;
  long lVar4;
  uint8 b;
  undefined1 local_29;
  
  iVar2 = -1;
  if (0xfffffff7 < size - 9U && writer != (IMkvWriter *)0x0) {
    uVar3 = (ulong)(uint)size;
    lVar4 = uVar3 * 8;
    do {
      lVar4 = lVar4 + -8;
      local_29 = (undefined1)(value >> ((byte)lVar4 & 0x3f));
      iVar1 = (**writer->_vptr_IMkvWriter)(writer,&local_29,1);
      if (iVar1 < 0) {
        return iVar1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int32 SerializeInt(IMkvWriter* writer, int64 value, int32 size) {
  if (!writer || size < 1 || size > 8)
    return -1;

  for (int32 i = 1; i <= size; ++i) {
    const int32 byte_count = size - i;
    const int32 bit_count = byte_count * 8;

    const int64 bb = value >> bit_count;
    const uint8 b = static_cast<uint8>(bb);

    const int32 status = writer->Write(&b, 1);

    if (status < 0)
      return status;
  }

  return 0;
}